

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

bool __thiscall cppnet::RWSocket::Recv(RWSocket *this,uint32_t len)

{
  uint64_t sockfd;
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  reference vec;
  size_type sVar4;
  int *piVar5;
  element_type *this_00;
  shared_ptr<cppnet::InnerBuffer> local_a8;
  enable_shared_from_this<cppnet::RWSocket> local_98;
  __normal_iterator<cppnet::Iovec_*,_std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>_>
  local_88;
  SysCallInt32Result local_7c;
  SysCallInt32Result ret;
  undefined1 local_60 [4];
  uint32_t buff_len;
  vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> io_vec;
  uint32_t expand;
  uint32_t uStack_38;
  bool need_expend;
  uint32_t expand_buff_len;
  uint32_t off_set;
  shared_ptr<cppnet::CppNetBase> cppnet_base;
  uint32_t len_local;
  RWSocket *this_local;
  
  cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = len;
  std::weak_ptr<cppnet::CppNetBase>::lock((weak_ptr<cppnet::CppNetBase> *)&off_set);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&off_set);
  if (bVar1) {
    if (cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ == 0) {
      cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = 0x1000;
    }
    uStack_38 = 0;
    expand = cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_;
    bVar1 = false;
    do {
      io_vec.super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      if ((bVar1) &&
         (io_vec.super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = expand, expand < 0x10000)) {
        expand = expand << 1;
      }
      std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::vector
                ((vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *)local_60);
      peVar3 = std::
               __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_read_buffer);
      uVar2 = (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[0x10])
                        (peVar3,(vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *)local_60,
                         (ulong)io_vec.
                                super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      sockfd = (this->super_Socket)._sock;
      local_88._M_current =
           (Iovec *)std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::begin
                              ((vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *)local_60);
      vec = __gnu_cxx::
            __normal_iterator<cppnet::Iovec_*,_std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>_>
            ::operator*(&local_88);
      sVar4 = std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::size
                        ((vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *)local_60);
      local_7c = OsHandle::Readv(sockfd,vec,(uint32_t)sVar4);
      if ((local_7c._return_value < 0) || (0 < local_7c._errno)) {
        piVar5 = __errno_location();
        if ((*piVar5 == 0xb) ||
           ((piVar5 = __errno_location(), *piVar5 == 0xb ||
            (piVar5 = __errno_location(), *piVar5 == 4)))) {
          peVar3 = std::
                   __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->_read_buffer);
          (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                    (peVar3,(ulong)local_7c & 0xffffffff);
          uStack_38 = local_7c._return_value + uStack_38;
          expand_buff_len = 3;
        }
        else {
          (*(this->super_Socket)._vptr_Socket[0x11])(this,2);
          this_local._7_1_ = 0;
          expand_buff_len = 1;
        }
      }
      else if (local_7c._return_value == 0) {
        (*(this->super_Socket)._vptr_Socket[0x11])(this,1);
        this_local._7_1_ = 0;
        expand_buff_len = 1;
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->_read_buffer);
        (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                  (peVar3,(ulong)local_7c & 0xffffffff);
        uStack_38 = local_7c._return_value + uStack_38;
        if ((uint)local_7c._return_value < uVar2) {
          expand_buff_len = 3;
        }
        else {
          bVar1 = true;
          expand_buff_len = 0;
        }
      }
      std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::~vector
                ((vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *)local_60);
    } while (expand_buff_len == 0);
    if (expand_buff_len == 3) {
      this_00 = std::
                __shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&off_set);
      std::enable_shared_from_this<cppnet::RWSocket>::shared_from_this(&local_98);
      std::shared_ptr<cppnet::InnerBuffer>::shared_ptr<cppnet::BufferQueue,void>
                (&local_a8,&this->_read_buffer);
      CppNetBase::OnRead(this_00,(shared_ptr<cppnet::RWSocket> *)&local_98,&local_a8,uStack_38);
      std::shared_ptr<cppnet::InnerBuffer>::~shared_ptr(&local_a8);
      std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)&local_98);
      this_local._7_1_ = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  std::shared_ptr<cppnet::CppNetBase>::~shared_ptr((shared_ptr<cppnet::CppNetBase> *)&off_set);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RWSocket::Recv(uint32_t len) {
    auto cppnet_base = _cppnet_base.lock();
    if (!cppnet_base) {
        return false;
    }
    if (len == 0) {
        len = __linux_read_buff_expand_len;
    }

    uint32_t off_set = 0;
    //read all data.
    uint32_t expand_buff_len = len;
    bool need_expend = false;
    while (true) {
        uint32_t expand = 0;
        if (need_expend) {
            expand = expand_buff_len;
            if (expand_buff_len < __linux_read_buff_expand_max) {
                expand_buff_len *= 2;
            }
        }

        std::vector<Iovec> io_vec;
        uint32_t buff_len = _read_buffer->GetFreeMemoryBlock(io_vec, expand);
        auto ret = OsHandle::Readv(_sock, &*io_vec.begin(), io_vec.size());
        if (ret._return_value < 0 || ret._errno > 0) {
            if (errno == EWOULDBLOCK || errno == EAGAIN || errno == EINTR) {
                _read_buffer->MoveWritePt(ret._return_value);
                off_set += ret._return_value;
                break;

            } else {
                OnDisConnect(CEC_CONNECT_BREAK);
                return false;
            }

        } else if (ret._return_value == 0) {
            OnDisConnect(CEC_CLOSED);
            return false;

        } else {
            _read_buffer->MoveWritePt(ret._return_value);
            off_set += ret._return_value;
            // read all
            if ((uint32_t)ret._return_value < buff_len) {
                break;
            }
            need_expend = true;
        }
    }
    cppnet_base->OnRead(shared_from_this(), _read_buffer, off_set);
    return true;
}